

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O2

void __thiscall
sc_core::sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::update
          (sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this)

{
  sc_writer_policy_check_delta::update
            (&(this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
              super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>.
              super_sc_writer_policy_check_delta);
  if ((this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).m_new_val.m_val ==
      (this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).m_cur_val.m_val) {
    return;
  }
  do_update(this);
  return;
}

Assistant:

void
sc_signal<sc_logic,POL>::update()
{
    policy_type::update();
    if( !( base_type::m_new_val == base_type::m_cur_val ) ) {
        do_update();
    }
}